

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

int __thiscall QAccessibleTable::columnCount(QAccessibleTable *this)

{
  int iVar1;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar2;
  QModelIndex *__return_storage_ptr__;
  long in_FS_OFFSET;
  int modelColumnCount;
  undefined1 local_44 [28];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(&this->super_QAccessibleObject);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar2 = QAbstractItemView::model(this_00);
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    iVar1 = 0;
  }
  else {
    __return_storage_ptr__ = (QModelIndex *)(local_44 + 4);
    QAbstractItemView::rootIndex(__return_storage_ptr__,this_00);
    local_44._4_4_ = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,__return_storage_ptr__);
    if (this->m_role == List) {
      local_44._0_4_ = 1;
      __return_storage_ptr__ = (QModelIndex *)(local_44 + 4);
      if (1 < (int)local_44._4_4_) {
        __return_storage_ptr__ = (QModelIndex *)local_44;
      }
    }
    iVar1 = __return_storage_ptr__->r;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::columnCount() const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return 0;
    const int modelColumnCount = theModel->columnCount(theView->rootIndex());
    return m_role == QAccessible::List ? qMin(1, modelColumnCount) : modelColumnCount;
}